

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.h
# Opt level: O0

void __thiscall adios2::format::BPBase::Stats<short>::Stats(Stats<short> *this)

{
  BPOpInfo *in_RDI;
  
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0xafc068);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0xafc076);
  helper::BlockDivisionInfo::BlockDivisionInfo((BlockDivisionInfo *)in_RDI);
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(uint16_t *)
   &in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(undefined2 *)
   ((long)&in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined2 *)
   ((long)&in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = Contiguous;
  *(undefined4 *)
   &in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  std::bitset<32UL>::bitset((bitset<32UL> *)0xafc104);
  *(undefined1 *)
   &in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  BPOpInfo::BPOpInfo(in_RDI);
  return;
}

Assistant:

Stats() : Min(), Max(), Value() {}